

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.h
# Opt level: O2

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::TypeCanonicalizerAndResolverTester
          (TypeCanonicalizerAndResolverTester *this,TestSuite *suite)

{
  long lVar1;
  initializer_list<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>
  __l;
  allocator_type local_979;
  pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*> local_978;
  code *local_950;
  undefined8 local_948;
  code *local_940;
  code *local_938;
  char *local_930;
  code *local_928;
  undefined8 local_920;
  code *local_918;
  code *local_910;
  char *local_908;
  code *local_900;
  undefined8 local_8f8;
  code *local_8f0;
  code *local_8e8;
  char *local_8e0;
  code *local_8d8;
  undefined8 local_8d0;
  code *local_8c8;
  code *local_8c0;
  char *local_8b8;
  code *local_8b0;
  undefined8 local_8a8;
  code *local_8a0;
  code *local_898;
  char *local_890;
  code *local_888;
  undefined8 local_880;
  code *local_878;
  code *local_870;
  char *local_868;
  code *local_860;
  undefined8 local_858;
  code *local_850;
  code *local_848;
  char *local_840;
  code *local_838;
  undefined8 local_830;
  code *local_828;
  code *local_820;
  char *local_818;
  code *local_810;
  undefined8 local_808;
  code *local_800;
  code *local_7f8;
  char *local_7f0;
  code *local_7e8;
  undefined8 local_7e0;
  code *local_7d8;
  code *local_7d0;
  char *local_7c8;
  code *local_7c0;
  undefined8 local_7b8;
  code *local_7b0;
  code *local_7a8;
  char *local_7a0;
  code *local_798;
  undefined8 local_790;
  code *local_788;
  code *local_780;
  char *local_778;
  code *local_770;
  undefined8 local_768;
  code *local_760;
  code *local_758;
  char *local_750;
  code *local_748;
  undefined8 local_740;
  code *local_738;
  code *local_730;
  char *local_728;
  code *local_720;
  undefined8 local_718;
  code *local_710;
  code *local_708;
  char *local_700;
  code *local_6f8;
  undefined8 local_6f0;
  code *local_6e8;
  code *local_6e0;
  char *local_6d8;
  code *local_6d0;
  undefined8 local_6c8;
  code *local_6c0;
  code *local_6b8;
  char *local_6b0;
  code *local_6a8;
  undefined8 local_6a0;
  code *local_698;
  code *local_690;
  char *local_688;
  code *local_680;
  undefined8 local_678;
  code *local_670;
  code *local_668;
  char *local_660;
  code *local_658;
  undefined8 local_650;
  code *local_648;
  code *local_640;
  char *local_638;
  code *local_630;
  undefined8 local_628;
  code *local_620;
  code *local_618;
  char *local_610;
  code *local_608;
  undefined8 local_600;
  code *local_5f8;
  code *local_5f0;
  char *local_5e8;
  code *local_5e0;
  undefined8 local_5d8;
  code *local_5d0;
  code *local_5c8;
  char *local_5c0;
  code *local_5b8;
  undefined8 local_5b0;
  code *local_5a8;
  code *local_5a0;
  char *local_598;
  code *local_590;
  undefined8 local_588;
  code *local_580;
  code *local_578;
  char *local_570;
  code *local_568;
  undefined8 local_560;
  code *local_558;
  code *local_550;
  char *local_548;
  code *local_540;
  undefined8 local_538;
  code *local_530;
  code *local_528;
  char *local_520;
  code *local_518;
  undefined8 local_510;
  code *local_508;
  code *local_500;
  char *local_4f8;
  code *local_4f0;
  undefined8 local_4e8;
  code *local_4e0;
  code *local_4d8;
  char *local_4d0;
  code *local_4c8;
  undefined8 local_4c0;
  code *local_4b8;
  code *local_4b0;
  char *local_4a8;
  code *local_4a0;
  undefined8 local_498;
  code *local_490;
  code *local_488;
  char *local_480;
  code *local_478;
  undefined8 local_470;
  code *local_468;
  code *local_460;
  char *local_458;
  code *local_450;
  undefined8 local_448;
  code *local_440;
  code *local_438;
  char *local_430;
  code *local_428;
  undefined8 local_420;
  code *local_418;
  code *local_410;
  char *local_408;
  code *local_400;
  undefined8 local_3f8;
  code *local_3f0;
  code *local_3e8;
  char *local_3e0;
  code *local_3d8;
  undefined8 local_3d0;
  code *local_3c8;
  code *local_3c0;
  char *local_3b8;
  code *local_3b0;
  undefined8 local_3a8;
  code *local_3a0;
  code *local_398;
  char *local_390;
  code *local_388;
  undefined8 local_380;
  code *local_378;
  code *local_370;
  char *local_368;
  code *local_360;
  undefined8 local_358;
  code *local_350;
  code *local_348;
  char *local_340;
  code *local_338;
  undefined8 local_330;
  code *local_328;
  code *local_320;
  char *local_318;
  code *local_310;
  undefined8 local_308;
  code *local_300;
  code *local_2f8;
  char *local_2f0;
  code *local_2e8;
  undefined8 local_2e0;
  code *local_2d8;
  code *local_2d0;
  char *local_2c8;
  code *local_2c0;
  undefined8 local_2b8;
  code *local_2b0;
  code *local_2a8;
  char *local_2a0;
  code *local_298;
  undefined8 local_290;
  code *local_288;
  code *local_280;
  char *local_278;
  code *local_270;
  undefined8 local_268;
  code *local_260;
  code *local_258;
  char *local_250;
  code *local_248;
  undefined8 local_240;
  code *local_238;
  code *local_230;
  char *local_228;
  code *local_220;
  undefined8 local_218;
  code *local_210;
  code *local_208;
  char *local_200;
  code *local_1f8;
  undefined8 local_1f0;
  code *local_1e8;
  code *local_1e0;
  char *local_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  code *local_1c0;
  code *local_1b8;
  char *local_1b0;
  code *local_1a8;
  undefined8 local_1a0;
  code *local_198;
  code *local_190;
  char *local_188;
  code *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  char *local_160;
  code *local_158;
  undefined8 local_150;
  code *local_148;
  code *local_140;
  char *local_138;
  code *local_130;
  undefined8 local_128;
  code *local_120;
  code *local_118;
  char *local_110;
  code *local_108;
  undefined8 local_100;
  code *local_f8;
  code *local_f0;
  char *local_e8;
  code *local_e0;
  undefined8 local_d8;
  code *local_d0;
  code *local_c8;
  char *local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  char *local_98;
  code *local_90;
  undefined8 local_88;
  code *local_80;
  code *local_78;
  char *local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  code *local_50;
  char *local_48;
  code *local_40;
  undefined8 local_38;
  code *local_30;
  code *local_28;
  char *local_20;
  
  (this->super_Tester).suite_ = suite;
  (this->super_Tester).cntPassed_ = 0;
  (this->super_Tester).cntFailed_ = 0;
  (this->super_Tester).curTestFunc_._M_dataplus._M_p =
       (pointer)&(this->super_Tester).curTestFunc_.field_2;
  (this->super_Tester).curTestFunc_._M_string_length = 0;
  (this->super_Tester).curTestFunc_.field_2._M_local_buf[0] = '\0';
  (this->super_Tester)._vptr_Tester =
       (_func_int **)&PTR__TypeCanonicalizerAndResolverTester_004da508;
  local_978.first.super__Function_base._M_functor._M_unused._M_function_pointer = case0000;
  local_978.first.super__Function_base._M_functor._8_8_ = 0;
  local_978.first._M_invoker =
       std::
       _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
       ::_M_invoke;
  local_978.first.super__Function_base._M_manager =
       std::
       _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
       ::_M_manager;
  local_978.second = "case0000";
  local_950 = case0001;
  local_948 = 0;
  local_938 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_940 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_930 = "case0001";
  local_928 = case0002;
  local_920 = 0;
  local_910 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_918 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_908 = "case0002";
  local_900 = case0003;
  local_8f8 = 0;
  local_8e8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_8f0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_8e0 = "case0003";
  local_8d8 = case0004;
  local_8d0 = 0;
  local_8c0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_8c8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_8b8 = "case0004";
  local_8b0 = case0005;
  local_8a8 = 0;
  local_898 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_8a0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_890 = "case0005";
  local_888 = case0006;
  local_880 = 0;
  local_870 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_878 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_868 = "case0006";
  local_860 = case0007;
  local_858 = 0;
  local_848 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_850 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_840 = "case0007";
  local_838 = case0008;
  local_830 = 0;
  local_820 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_828 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_818 = "case0008";
  local_810 = case0009;
  local_808 = 0;
  local_7f8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_800 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_7f0 = "case0009";
  local_7e8 = case0010;
  local_7e0 = 0;
  local_7d0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_7d8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_7c8 = "case0010";
  local_7c0 = case0011;
  local_7b8 = 0;
  local_7a8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_7b0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_7a0 = "case0011";
  local_798 = case0012;
  local_790 = 0;
  local_780 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_788 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_778 = "case0012";
  local_770 = case0013;
  local_768 = 0;
  local_758 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_760 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_750 = "case0013";
  local_748 = case0014;
  local_740 = 0;
  local_730 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_738 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_728 = "case0014";
  local_720 = case0015;
  local_718 = 0;
  local_708 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_710 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_700 = "case0015";
  local_6f8 = case0016;
  local_6f0 = 0;
  local_6e0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_6e8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_6d8 = "case0016";
  local_6d0 = case0017;
  local_6c8 = 0;
  local_6b8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_6c0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_6b0 = "case0017";
  local_6a8 = case0018;
  local_6a0 = 0;
  local_690 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_698 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_688 = "case0018";
  local_680 = case0019;
  local_678 = 0;
  local_668 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_670 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_660 = "case0019";
  local_658 = case0020;
  local_650 = 0;
  local_640 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_648 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_638 = "case0020";
  local_630 = case0021;
  local_628 = 0;
  local_618 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_620 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_610 = "case0021";
  local_608 = case0022;
  local_600 = 0;
  local_5f0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_5f8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_5e8 = "case0022";
  local_5e0 = case0023;
  local_5d8 = 0;
  local_5c8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_5d0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_5c0 = "case0023";
  local_5b8 = case0024;
  local_5b0 = 0;
  local_5a0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_5a8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_598 = "case0024";
  local_590 = case0025;
  local_588 = 0;
  local_578 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_580 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_570 = "case0025";
  local_568 = case0026;
  local_560 = 0;
  local_550 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_558 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_548 = "case0026";
  local_540 = case0027;
  local_538 = 0;
  local_528 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_530 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_520 = "case0027";
  local_518 = case0028;
  local_510 = 0;
  local_500 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_508 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_4f8 = "case0028";
  local_4f0 = case0029;
  local_4e8 = 0;
  local_4d8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_4e0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_4d0 = "case0029";
  local_4c8 = case0030;
  local_4c0 = 0;
  local_4b0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_4b8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_4a8 = "case0030";
  local_4a0 = case0031;
  local_498 = 0;
  local_488 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_490 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_480 = "case0031";
  local_478 = case0032;
  local_470 = 0;
  local_460 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_468 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_458 = "case0032";
  local_450 = case0033;
  local_448 = 0;
  local_438 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_440 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_430 = "case0033";
  local_428 = case0034;
  local_420 = 0;
  local_410 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_418 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_408 = "case0034";
  local_400 = case0035;
  local_3f8 = 0;
  local_3e8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_3f0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_3e0 = "case0035";
  local_3d8 = case0036;
  local_3d0 = 0;
  local_3c0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_3c8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_3b8 = "case0036";
  local_3b0 = case0037;
  local_3a8 = 0;
  local_398 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_3a0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_390 = "case0037";
  local_388 = case0038;
  local_380 = 0;
  local_370 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_378 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_368 = "case0038";
  local_360 = case0039;
  local_358 = 0;
  local_348 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_350 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_340 = "case0039";
  local_338 = case0040;
  local_330 = 0;
  local_320 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_328 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_318 = "case0040";
  local_310 = case0041;
  local_308 = 0;
  local_2f8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_300 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_2f0 = "case0041";
  local_2e8 = case0042;
  local_2e0 = 0;
  local_2d0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_2d8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_2c8 = "case0042";
  local_2c0 = case0043;
  local_2b8 = 0;
  local_2a8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_2b0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_2a0 = "case0043";
  local_298 = case0044;
  local_290 = 0;
  local_280 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_288 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_278 = "case0044";
  local_270 = case0045;
  local_268 = 0;
  local_258 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_260 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_250 = "case0045";
  local_248 = case0046;
  local_240 = 0;
  local_230 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_228 = "case0046";
  local_220 = case0047;
  local_218 = 0;
  local_208 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_210 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_200 = "case0047";
  local_1f8 = case0048;
  local_1f0 = 0;
  local_1e0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_1d8 = "case0048";
  local_1d0 = case0049;
  local_1c8 = 0;
  local_1b8 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_1b0 = "case0049";
  local_1a8 = case0050;
  local_1a0 = 0;
  local_190 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_188 = "case0050";
  local_180 = case0051;
  local_178 = 0;
  local_168 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_170 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_160 = "case0051";
  local_158 = case0052;
  local_150 = 0;
  local_140 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_138 = "case0052";
  local_130 = case0053;
  local_128 = 0;
  local_118 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
              ::_M_manager;
  local_110 = "case0053";
  local_108 = case0054;
  local_100 = 0;
  local_f0 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_e8 = "case0054";
  local_e0 = case0055;
  local_d8 = 0;
  local_c8 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_d0 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_c0 = "case0055";
  local_b8 = case0056;
  local_b0 = 0;
  local_a0 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_98 = "case0056";
  local_90 = case0057;
  local_88 = 0;
  local_78 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_70 = "case0057";
  local_68 = case0058;
  local_60 = 0;
  local_50 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_48 = "case0058";
  local_40 = case0059;
  local_38 = 0;
  local_28 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(psy::C::TypeCanonicalizerAndResolverTester_*),_void_(psy::C::TypeCanonicalizerAndResolverTester::*)()>
             ::_M_manager;
  local_20 = "case0059";
  __l._M_len = 0x3c;
  __l._M_array = &local_978;
  std::
  vector<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>,_std::allocator<std::pair<std::function<void_(psy::C::TypeCanonicalizerAndResolverTester_*)>,_const_char_*>_>_>
  ::vector(&this->tests_,__l,&local_979);
  lVar1 = 0x938;
  do {
    std::_Function_base::~_Function_base
              ((_Function_base *)((long)&local_978.first.super__Function_base._M_functor + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  return;
}

Assistant:

TypeCanonicalizerAndResolverTester(TestSuite* suite)
        : Tester(suite)
    {}